

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

bool __thiscall
perfetto::protos::gen::TracingServiceState_Producer::ParseFromArray
          (TracingServiceState_Producer *this,void *raw,size_t size)

{
  byte bVar1;
  undefined1 uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  ulong *puVar8;
  ulong *puVar9;
  bool bVar10;
  ulong *puVar11;
  ulong uVar12;
  ulong *puVar13;
  ulong *puVar14;
  ulong uVar15;
  ulong *in_R11;
  uint *puVar16;
  ulong *puVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dst;
  bool bVar18;
  ulong *local_78;
  Field local_70;
  TracingServiceState_Producer *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  ulong *local_50;
  ulong *local_48;
  string *local_40;
  string *local_38;
  
  dst = &this->unknown_fields_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar17 = (ulong *)(size + (long)raw);
  do {
    lVar7 = 7;
    if (raw < puVar17) {
      uVar12 = (ulong)(char)(byte)*raw;
      puVar9 = (ulong *)((long)raw + 1);
      if ((long)uVar12 < 0) {
        bVar1 = (byte)*raw;
        uVar4 = (ulong)(bVar1 & 0x7f);
        bVar10 = false;
        puVar13 = puVar9;
        for (; (uVar12 = uVar4, puVar14 = puVar13, (char)bVar1 < '\0' &&
               (bVar18 = 0x38 < lVar7 - 7U, bVar10 = bVar18 || puVar17 <= puVar13, uVar12 = 0,
               puVar14 = puVar9, !bVar18 && puVar17 > puVar13)); lVar7 = lVar7 + 7) {
          bVar1 = (byte)*puVar13;
          in_R11 = (ulong *)((ulong)(bVar1 & 0x7f) << ((byte)lVar7 & 0x3f));
          puVar13 = (ulong *)((long)puVar13 + 1);
          uVar4 = uVar4 | (ulong)in_R11;
        }
        puVar9 = puVar14;
        if (bVar10) {
          puVar9 = (ulong *)raw;
          uVar12 = 0;
        }
        if (puVar9 == (ulong *)raw) goto LAB_0023689e;
      }
      uVar3 = (uint)(uVar12 >> 3);
      if ((uVar3 == 0) || (puVar17 <= puVar9)) {
switchD_00236616_caseD_3:
        local_70.int_value_ = 0;
        bVar10 = false;
        uVar12 = 0;
        goto LAB_0023680f;
      }
      switch((uint)uVar12 & 7) {
      case 0:
        puVar11 = (ulong *)0x0;
        bVar10 = puVar9 >= puVar17;
        if (puVar9 < puVar17) {
          in_R11 = (ulong *)((long)puVar9 + 1);
          puVar13 = (ulong *)(ulong)((byte)*puVar9 & 0x7f);
          puVar14 = puVar13;
          uVar5 = 0;
          if ((char)(byte)*puVar9 < '\0') {
            puVar14 = (ulong *)0x0;
            uVar5 = 0;
            lVar7 = 7;
            puVar8 = in_R11;
            do {
              bVar18 = 0x38 < lVar7 - 7U;
              bVar10 = bVar18 || puVar17 <= puVar8;
              if (bVar18 || puVar17 <= puVar8) goto LAB_002367a2;
              uVar4 = *puVar8;
              puVar8 = (ulong *)((long)puVar8 + 1);
              puVar13 = (ulong *)((ulong)puVar13 |
                                 (ulong)((byte)uVar4 & 0x7f) << ((byte)lVar7 & 0x3f));
              lVar7 = lVar7 + 7;
            } while ((char)(byte)uVar4 < '\0');
            puVar14 = (ulong *)((ulong)puVar13 & 0xffffffff);
            in_R11 = puVar8;
            uVar5 = (uint)((ulong)puVar13 >> 0x20);
          }
        }
        else {
          puVar14 = (ulong *)0x0;
          uVar5 = 0;
        }
LAB_002367a2:
        puVar13 = (ulong *)(ulong)uVar5;
        if (bVar10) {
          in_R11 = puVar9;
          puVar13 = puVar11;
          puVar14 = puVar11;
        }
        local_78 = puVar9;
        local_48 = (ulong *)raw;
        if (in_R11 != puVar9) goto LAB_002367ca;
        bVar10 = false;
        goto LAB_0023679b;
      case 1:
        in_R11 = puVar9 + 1;
        if (puVar17 < in_R11) {
LAB_00236794:
          bVar10 = false;
          goto LAB_0023679b;
        }
        puVar14 = (ulong *)*puVar9;
        puVar13 = (ulong *)((ulong)puVar14 >> 0x20);
        break;
      case 2:
        bVar10 = puVar9 >= puVar17;
        puVar13 = local_50;
        if (puVar9 < puVar17) {
          puVar14 = (ulong *)((long)puVar9 + 1);
          puVar11 = (ulong *)(ulong)((byte)*puVar9 & 0x7f);
          in_R11 = puVar14;
          puVar13 = puVar11;
          if ((char)(byte)*puVar9 < '\0') {
            lVar7 = 7;
            puVar8 = puVar14;
            do {
              bVar10 = 0x38 < lVar7 - 7U || puVar17 <= puVar8;
              in_R11 = puVar14;
              puVar13 = local_50;
              if (bVar10) break;
              uVar4 = *puVar8;
              puVar8 = (ulong *)((long)puVar8 + 1);
              puVar11 = (ulong *)((ulong)puVar11 |
                                 (ulong)((byte)uVar4 & 0x7f) << ((byte)lVar7 & 0x3f));
              lVar7 = lVar7 + 7;
              in_R11 = puVar8;
              puVar13 = puVar11;
            } while ((char)(byte)uVar4 < '\0');
          }
        }
        local_50 = puVar13;
        if (bVar10) {
          in_R11 = puVar9;
          local_50 = (ulong *)0x0;
        }
        if ((in_R11 == puVar9) || ((ulong *)((long)puVar17 - (long)in_R11) < local_50)) {
          puVar13 = (ulong *)0x0;
          puVar14 = (ulong *)0x0;
          bVar10 = false;
          puVar11 = (ulong *)0x0;
        }
        else {
          puVar13 = (ulong *)((ulong)in_R11 >> 0x20);
          puVar14 = (ulong *)((ulong)in_R11 & 0xffffffff);
          in_R11 = (ulong *)((long)in_R11 + (long)local_50);
          bVar10 = true;
          puVar11 = local_50;
        }
        local_78 = puVar9;
        if (!bVar10) goto LAB_00236794;
        goto LAB_002367ca;
      default:
        goto switchD_00236616_caseD_3;
      case 5:
        in_R11 = (ulong *)((long)puVar9 + 4);
        puVar13 = (ulong *)0x0;
        if (puVar17 < in_R11) goto LAB_0023689e;
        puVar14 = (ulong *)(ulong)(uint)*puVar9;
      }
      puVar11 = (ulong *)0x0;
LAB_002367ca:
      raw = in_R11;
      bVar10 = true;
      in_R11 = (ulong *)raw;
      if (uVar3 < 0x10000) {
        bVar10 = (ulong *)0xfffffff < puVar11;
        if (bVar10) {
          local_70.int_value_ = 0;
          uVar12 = 0;
        }
        else {
          local_70.int_value_ = (ulong)puVar14 & 0xffffffff | (long)puVar13 << 0x20;
          uVar12 = (ulong)puVar11 | (uVar12 >> 3) << 0x20 | (ulong)((uint)uVar12 & 7) << 0x30;
        }
      }
      else {
LAB_0023679b:
        local_70.int_value_ = 0;
        uVar12 = 0;
      }
    }
    else {
LAB_0023689e:
      local_70.int_value_ = 0;
      uVar12 = 0;
      bVar10 = false;
    }
LAB_0023680f:
    puVar16 = &switchD_00236616::switchdataD_0034d67c;
    if (!bVar10) {
      local_70.size_ = (uint32_t)uVar12;
      local_70.type_ = (uint8_t)(uVar12 >> 0x30);
      local_70.id_ = (uint16_t)(uVar12 >> 0x20);
      if (local_70.id_ != 0) {
        local_38 = &this->sdk_version_;
        local_40 = &this->name_;
        local_60 = this;
        local_58 = dst;
        do {
          if ((ushort)(uVar12 >> 0x20) < 6) {
            (this->_has_field_).super__Base_bitset<1UL>._M_w =
                 (this->_has_field_).super__Base_bitset<1UL>._M_w |
                 1L << ((byte)(uVar12 >> 0x20) & 0x3f);
          }
          uVar3 = ((uint)(uVar12 >> 0x20) & 0xffff) - 1;
          if (uVar3 < 5) {
            uVar2 = (*(code *)(&DAT_0034d694 + *(int *)(&DAT_0034d694 + (ulong)uVar3 * 4)))();
            return (bool)uVar2;
          }
          protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>(&local_70,dst);
          do {
            if (puVar17 <= raw) goto LAB_00236a15;
            uVar12 = (ulong)(char)(byte)*raw;
            puVar9 = (ulong *)((long)raw + 1);
            if ((long)uVar12 < 0) {
              uVar4 = (ulong)((byte)*raw & 0x7f);
              bVar10 = false;
              uVar12 = uVar4;
              puVar13 = puVar9;
              if ((char)(byte)*raw < '\0') {
                lVar7 = 7;
                puVar14 = puVar9;
                do {
                  bVar10 = 0x38 < lVar7 - 7U || puVar17 <= puVar14;
                  uVar12 = 0;
                  puVar13 = puVar9;
                  if (bVar10) break;
                  uVar15 = *puVar14;
                  puVar13 = (ulong *)((long)puVar14 + 1);
                  uVar4 = uVar4 | (ulong)((byte)uVar15 & 0x7f) << ((byte)lVar7 & 0x3f);
                  lVar7 = lVar7 + 7;
                  uVar12 = uVar4;
                  puVar14 = puVar13;
                } while ((char)(byte)uVar15 < '\0');
              }
              puVar9 = puVar13;
              if (bVar10) {
                puVar9 = (ulong *)raw;
                uVar12 = 0;
              }
              if (puVar9 == (ulong *)raw) goto LAB_00236a15;
            }
            uVar3 = (uint)(uVar12 >> 3);
            if ((uVar3 == 0) || (puVar17 <= puVar9)) {
switchD_00236aa7_caseD_3:
              local_70.int_value_ = 0;
              bVar10 = false;
              uVar12 = 0;
              goto LAB_00236cdb;
            }
            switch((uint)uVar12 & 7) {
            case 0:
              local_70.int_value_ = 0;
              bVar10 = puVar9 >= puVar17;
              if (puVar9 < puVar17) {
                puVar13 = (ulong *)((long)puVar9 + 1);
                bVar1 = (byte)*puVar9;
                uVar15 = (ulong)(bVar1 & 0x7f);
                uVar4 = uVar15;
                if ((char)bVar1 < '\0') {
                  uVar4 = 0;
                }
                uVar5 = (uint)uVar4;
                puVar16 = (uint *)puVar13;
                uVar6 = 0;
                if ((char)bVar1 < '\0') {
                  lVar7 = 7;
                  puVar14 = puVar13;
                  do {
                    uVar5 = (uint)uVar4;
                    bVar10 = 0x38 < lVar7 - 7U || puVar17 <= puVar14;
                    puVar16 = (uint *)puVar13;
                    uVar6 = 0;
                    if (bVar10) break;
                    bVar1 = (byte)*puVar14;
                    puVar14 = (ulong *)((long)puVar14 + 1);
                    uVar15 = uVar15 | (ulong)(bVar1 & 0x7f) << ((byte)lVar7 & 0x3f);
                    lVar7 = lVar7 + 7;
                    if (-1 < (char)bVar1) {
                      uVar4 = uVar15 & 0xffffffff;
                    }
                    uVar5 = (uint)uVar4;
                    uVar6 = (uint)(uVar15 >> 0x20);
                    puVar16 = (uint *)puVar14;
                  } while (-1 >= (char)bVar1);
                }
              }
              else {
                uVar5 = 0;
                uVar6 = 0;
              }
              if (bVar10) {
                uVar5 = 0;
              }
              puVar13 = (ulong *)(ulong)uVar6;
              if (bVar10) {
                puVar16 = (uint *)puVar9;
                puVar13 = (ulong *)local_70.int_value_;
              }
              this = local_60;
              puVar14 = (ulong *)local_70.int_value_;
              dst = local_58;
              local_50 = puVar9;
              local_48 = (ulong *)raw;
              if ((ulong *)puVar16 == puVar9) {
                uVar12 = 0;
                bVar10 = false;
              }
              else {
LAB_00236c91:
                raw = puVar16;
                bVar10 = true;
                puVar16 = (uint *)raw;
                if ((uVar3 < 0x10000) && (puVar14 < (ulong *)0x10000000)) {
                  local_70.int_value_ = (ulong)uVar5 | (long)puVar13 << 0x20;
                  uVar12 = (ulong)puVar14 | (uVar12 >> 3) << 0x20 | (uVar12 & 7) << 0x30;
                  bVar10 = false;
                }
                else {
                  local_70.int_value_ = 0;
                  uVar12 = 0;
                }
              }
              break;
            case 1:
              puVar16 = (uint *)(puVar9 + 1);
              if (puVar16 <= puVar17) {
                uVar4 = *puVar9;
                puVar13 = (ulong *)(uVar4 >> 0x20);
LAB_00236b10:
                uVar5 = (uint)uVar4;
                puVar14 = (ulong *)0x0;
                goto LAB_00236c91;
              }
              goto LAB_00236a15;
            case 2:
              bVar10 = puVar9 >= puVar17;
              puVar13 = local_78;
              if (puVar9 < puVar17) {
                puVar14 = (ulong *)((long)puVar9 + 1);
                puVar11 = (ulong *)(ulong)((byte)*puVar9 & 0x7f);
                puVar16 = (uint *)puVar14;
                puVar13 = puVar11;
                if ((char)(byte)*puVar9 < '\0') {
                  lVar7 = 7;
                  puVar8 = puVar14;
                  do {
                    bVar10 = 0x38 < lVar7 - 7U || puVar17 <= puVar8;
                    puVar16 = (uint *)puVar14;
                    puVar13 = local_78;
                    if (bVar10) break;
                    uVar4 = *puVar8;
                    puVar8 = (ulong *)((long)puVar8 + 1);
                    puVar11 = (ulong *)((ulong)puVar11 |
                                       (ulong)((byte)uVar4 & 0x7f) << ((byte)lVar7 & 0x3f));
                    lVar7 = lVar7 + 7;
                    puVar16 = (uint *)puVar8;
                    puVar13 = puVar11;
                  } while ((char)(byte)uVar4 < '\0');
                }
              }
              local_78 = puVar13;
              uVar5 = 0;
              if (bVar10) {
                puVar16 = (uint *)puVar9;
                local_78 = (ulong *)0x0;
              }
              if ((ulong *)puVar16 == puVar9) {
                puVar13 = (ulong *)0x0;
                bVar10 = false;
                puVar14 = (ulong *)0x0;
              }
              else if ((ulong *)((long)puVar17 - (long)puVar16) < local_78) {
                uVar5 = 0;
                puVar13 = (ulong *)0x0;
                bVar10 = false;
                puVar14 = (ulong *)0x0;
              }
              else {
                puVar13 = (ulong *)((ulong)puVar16 >> 0x20);
                uVar5 = (uint)puVar16;
                puVar16 = (uint *)((long)puVar16 + (long)local_78);
                bVar10 = true;
                puVar14 = local_78;
              }
              this = local_60;
              if (bVar10) goto LAB_00236c91;
              local_70.int_value_ = 0;
              uVar12 = 0;
              bVar10 = false;
              break;
            default:
              goto switchD_00236aa7_caseD_3;
            case 5:
              puVar16 = (uint *)((long)puVar9 + 4);
              puVar13 = (ulong *)0x0;
              if (puVar16 <= puVar17) {
                uVar4 = (ulong)(uint)*puVar9;
                goto LAB_00236b10;
              }
LAB_00236a15:
              local_70.int_value_ = 0;
              uVar12 = 0;
              bVar10 = false;
            }
LAB_00236cdb:
          } while (bVar10);
          local_70.size_ = (uint32_t)uVar12;
          local_70.type_ = (uint8_t)(uVar12 >> 0x30);
          local_70.id_ = (uint16_t)(uVar12 >> 0x20);
        } while (local_70.id_ != 0);
      }
      return puVar17 == (ulong *)raw;
    }
  } while( true );
}

Assistant:

bool TracingServiceState_Producer::ParseFromArray(const void* raw, size_t size) {
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* id */:
        field.get(&id_);
        break;
      case 2 /* name */:
        field.get(&name_);
        break;
      case 5 /* pid */:
        field.get(&pid_);
        break;
      case 3 /* uid */:
        field.get(&uid_);
        break;
      case 4 /* sdk_version */:
        field.get(&sdk_version_);
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}